

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void av1_decode_tg_tiles_and_wrapup
               (AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,uint8_t **p_data_end,int start_tile,
               int end_tile,int initialize_flag)

{
  AV1_COMMON *cm_00;
  AV1CdefSync *cdef_sync;
  uint *puVar1;
  aom_internal_error_info *info;
  undefined8 *puVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  size_t size;
  DecWorkerData *pDVar5;
  AVxWorker *pAVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  void *__src;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  aom_bit_depth_t aVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  SequenceHeader *pSVar21;
  TileDataDec *pTVar22;
  uint8_t *puVar23;
  pthread_mutex_t *ppVar24;
  pthread_cond_t *ppVar25;
  int *piVar26;
  CB_BUFFER *__s;
  long lVar27;
  pthread_cond_t *__cond;
  AVxWorkerInterface *pAVar28;
  AVxWorker *pAVar29;
  byte bVar30;
  uint uVar31;
  uint uVar32;
  int tile_row;
  uint uVar33;
  int iVar34;
  ulong uVar35;
  FRAME_CONTEXT *__dest;
  long lVar36;
  ulong uVar37;
  undefined2 uVar38;
  qm_val_t *(*__src_00) [19];
  uint uVar39;
  ulong uVar40;
  YV12_BUFFER_CONFIG *pYVar41;
  aom_reader *paVar42;
  uint uVar43;
  TileInfo *pTVar44;
  uint uVar45;
  long lVar46;
  int iVar47;
  uint16_t *dest16;
  RestorationInfo *rsi;
  qm_val_t *(*__dest_00) [19];
  long lVar48;
  AV1DecRowMTSync *dec_row_mt_sync;
  char *pcVar49;
  uint uVar50;
  bool bVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  int iVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar70;
  undefined1 auVar69 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar73 [16];
  uint local_150;
  ThreadData *local_130;
  uint8_t *local_120;
  AV1_COMMON *cm;
  uint local_ec;
  uint local_c0;
  TileBufferDec (*local_b8) [64];
  uint local_9c;
  uint *local_90;
  int local_78;
  int local_74;
  ulong local_70;
  uint8_t **local_68;
  ulong local_60;
  qm_val_t *(*local_58) [19];
  int *local_50;
  CFL_CTX *local_48;
  CB_BUFFER *local_40;
  TileBufferDec (*local_38) [64];
  
  cm_00 = &pbi->common;
  (pbi->dcb).xd.error_info = (pbi->common).error;
  local_68 = p_data_end;
  if (initialize_flag != 0) {
    if ((((pbi->common).rst_info[0].frame_restoration_type == RESTORE_NONE) &&
        ((pbi->common).rst_info[1].frame_restoration_type == RESTORE_NONE)) &&
       ((pbi->common).rst_info[2].frame_restoration_type == RESTORE_NONE)) {
      pSVar21 = (pbi->common).seq_params;
    }
    else {
      rsi = (pbi->common).rst_info;
      av1_alloc_restoration_buffers(cm_00,true);
      uVar35 = 0;
      do {
        av1_alloc_restoration_struct(cm_00,rsi,(uint)(uVar35 != 0));
        pSVar21 = (pbi->common).seq_params;
        if (1 < uVar35) break;
        uVar35 = uVar35 + 1;
        rsi = rsi + 1;
      } while (pSVar21->monochrome == '\0');
    }
    bVar30 = pSVar21->use_highbitdepth;
    iVar47 = 0x11040 << (bVar30 & 0x1f);
    if ((pbi->td).mc_buf_size != iVar47) {
      av1_free_mc_tmp_buf(&pbi->td);
      allocate_mc_tmp_buf(cm_00,&pbi->td,iVar47,(uint)bVar30);
    }
  }
  uVar3 = ((pbi->common).seq_params)->monochrome;
  uVar33 = pbi->max_threads;
  uVar45 = (pbi->common).tiles.large_scale;
  if ((int)uVar33 < 2) {
LAB_0016703b:
    uVar33 = (pbi->common).tiles.cols;
    local_c0 = (pbi->common).tiles.rows;
    local_ec = local_c0 * uVar33;
    uVar50 = pbi->dec_tile_row;
    uVar31 = pbi->dec_tile_col;
    if (uVar45 == 0) {
LAB_001672fb:
      local_9c = pbi->inv_tile_order;
      uVar40 = 0;
      uVar37 = 1;
      uVar35 = 0;
      uVar32 = local_c0;
      uVar43 = uVar33;
      uVar45 = local_9c;
    }
    else {
LAB_00167092:
      uVar45 = uVar33;
      if ((int)uVar31 < (int)uVar33) {
        uVar45 = uVar31;
      }
      uVar43 = local_c0;
      if ((int)uVar50 < (int)local_c0) {
        uVar43 = uVar50;
      }
      uVar37 = 0;
      uVar32 = uVar43 + 1;
      uVar35 = (ulong)uVar43;
      if ((int)uVar50 < 0) {
        uVar32 = local_c0;
        uVar35 = uVar37;
      }
      uVar43 = uVar45 + 1;
      uVar40 = (ulong)uVar45;
      if ((int)uVar31 < 0) {
        uVar43 = uVar33;
        uVar40 = uVar37;
      }
      bVar52 = pbi->inv_tile_order != 0;
      local_9c = (uint)((int)uVar50 < 0 && bVar52);
      uVar45 = (uint)((int)uVar31 < 0 && bVar52);
    }
    local_90 = &(pbi->common).tiles.large_scale;
    local_b8 = pbi->tile_buffers;
    local_130 = &pbi->td;
    if (((((int)uVar35 < (int)uVar32) && ((int)uVar40 < (int)uVar43)) &&
        ((int)((int)uVar35 * uVar33 + (int)uVar40) <= end_tile)) &&
       (start_tile < (int)((uVar32 - 1) * uVar33 + uVar43))) {
      local_70 = uVar40;
      if ((char)uVar37 == '\0') {
        if (pbi->ext_tile_debug == 0) {
          local_b8[(int)uVar50][(int)uVar31].data = data;
          uVar39 = pbi->coded_tile_data_size;
          local_b8[(int)uVar50][(int)uVar31].size = (ulong)uVar39;
          local_120 = data + uVar39;
        }
        else {
          local_120 = get_ls_tile_buffers(pbi,data,data_end,local_b8);
        }
        bVar30 = 0;
      }
      else {
        bVar30 = (pbi->common).features.disable_cdf_update ^ 1;
        get_tile_buffers(pbi,data,data_end,local_b8,start_tile,end_tile);
        local_120 = (uint8_t *)0x0;
      }
      if ((pbi->tile_data == (TileDataDec *)0x0) || (local_ec != pbi->allocated_tiles)) {
        aom_free(pbi->tile_data);
        pbi->allocated_tiles = 0;
        pTVar22 = (TileDataDec *)aom_memalign(0x20,(long)(int)local_ec * 0x53a0);
        pbi->tile_data = pTVar22;
        if (pTVar22 == (TileDataDec *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pbi->tile_data");
        }
        pbi->allocated_tiles = local_ec;
        if (0 < (int)local_ec) {
          lVar36 = 0;
          do {
            pTVar22 = pbi->tile_data;
            puVar2 = (undefined8 *)((long)&(pTVar22->dec_row_mt_sync).mi_rows_parse_done + lVar36);
            *puVar2 = 0;
            puVar2[1] = 0;
            puVar2 = (undefined8 *)((long)&(pTVar22->dec_row_mt_sync).sync_range + lVar36);
            *puVar2 = 0;
            puVar2[1] = 0;
            puVar2 = (undefined8 *)((long)&(pTVar22->dec_row_mt_sync).allocated_sb_rows + lVar36);
            *puVar2 = 0;
            puVar2[1] = 0;
            puVar2 = (undefined8 *)((long)&(pTVar22->dec_row_mt_sync).mutex_ + lVar36);
            *puVar2 = 0;
            puVar2[1] = 0;
            lVar36 = lVar36 + 0x53a0;
          } while ((ulong)local_ec * 0x53a0 - lVar36 != 0);
        }
        pbi->allocated_row_mt_sync_rows = 0;
      }
      if ((pbi->dcb).xd.seg_mask == (uint8_t *)0x0) {
        puVar23 = (uint8_t *)aom_memalign(0x10,0x8000);
        (pbi->dcb).xd.seg_mask = puVar23;
        if (puVar23 == (uint8_t *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pbi->dcb.xd.seg_mask");
        }
      }
      (pbi->td).read_coeffs_tx_intra_block_visit = read_coeffs_tx_intra_block;
      (pbi->td).read_coeffs_tx_inter_block_visit = av1_read_coeffs_txb;
      (pbi->td).predict_and_recon_intra_block_visit = predict_and_reconstruct_intra_block;
      (pbi->td).inverse_tx_inter_block_visit = inverse_transform_inter_block;
      (pbi->td).predict_inter_block_visit = predict_inter_block;
      (pbi->td).cfl_store_inter_block_visit = cfl_store_inter_block;
      memcpy(local_130,pbi,0x3b60);
      (pbi->td).dcb.corrupted = 0;
      puVar23 = (pbi->td).mc_buf[1];
      (pbi->td).dcb.mc_buf[0] = (pbi->td).mc_buf[0];
      (pbi->td).dcb.mc_buf[1] = puVar23;
      (pbi->td).dcb.xd.tmp_conv_dst = (pbi->td).tmp_conv_dst;
      puVar23 = (pbi->td).tmp_obmc_bufs[1];
      (pbi->td).dcb.xd.tmp_obmc_bufs[0] = (pbi->td).tmp_obmc_bufs[0];
      (pbi->td).dcb.xd.tmp_obmc_bufs[1] = puVar23;
      local_40 = &(pbi->td).cb_buffer_base;
      pTVar44 = &(pbi->td).dcb.xd.tile;
      info = &pbi->error;
      local_48 = &(pbi->td).dcb.xd.cfl;
      local_50 = &(pbi->dcb).corrupted;
      local_58 = (pbi->td).dcb.xd.plane[0].seg_iqmatrix;
      uVar37 = local_70;
      do {
        uVar50 = ~(uint)uVar35 + local_c0;
        if (local_9c == 0) {
          uVar50 = (uint)uVar35;
        }
        lVar36 = (long)(int)uVar50;
        local_38 = local_b8 + lVar36;
        uVar40 = uVar37 & 0xffffffff;
        local_60 = uVar35;
        do {
          uVar39 = (uint)uVar40;
          uVar31 = ~uVar39 + uVar33;
          if (uVar45 == 0) {
            uVar31 = uVar39;
          }
          lVar48 = (pbi->common).tiles.cols * lVar36;
          iVar47 = (int)lVar48 + uVar31;
          if (iVar47 <= end_tile && start_tile <= iVar47) {
            pTVar22 = pbi->tile_data;
            (pbi->td).bit_reader = &pTVar22[lVar48 + (int)uVar31].bit_reader;
            memset(local_40,0,0x30000);
            av1_tile_init(pTVar44,cm_00,uVar50,uVar31);
            (pbi->td).dcb.xd.current_base_qindex = (pbi->common).quant_params.base_qindex;
            puVar23 = (*local_38)[(int)uVar31].data;
            size = (*local_38)[(int)uVar31].size;
            paVar42 = (pbi->td).bit_reader;
            if ((ulong)((long)data_end - (long)puVar23) <= size - 1) {
              (local_130->dcb).xd.mi_row = pTVar44->mi_row_start;
              aom_internal_error(info,AOM_CODEC_CORRUPT_FRAME,
                                 "Truncated packet or corrupt tile length");
            }
            iVar47 = aom_reader_init(paVar42,puVar23,size);
            if (iVar47 != 0) {
              (local_130->dcb).xd.mi_row = pTVar44->mi_row_start;
              aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate bool decoder %d",1);
            }
            paVar42->allow_update_cdf = bVar30;
            pSVar21 = (pbi->common).seq_params;
            uVar4 = pSVar21->monochrome;
            uVar35 = 0;
            __dest_00 = local_58;
            do {
              if (*(char *)((long)(__dest_00 + -2) + 0x80) == '\0') {
                uVar10 = *(undefined8 *)(pbi->common).quant_params.y_dequant_QTX;
                uVar11 = *(undefined8 *)((pbi->common).quant_params.y_dequant_QTX + 2);
                uVar12 = *(undefined8 *)((pbi->common).quant_params.y_dequant_QTX + 6);
                *(undefined8 *)((long)(__dest_00 + -1) + 0x78) =
                     *(undefined8 *)((pbi->common).quant_params.y_dequant_QTX + 4);
                *(undefined8 *)((long)(__dest_00 + -1) + 0x80) = uVar12;
                *(undefined8 *)((long)(__dest_00 + -1) + 0x68) = uVar10;
                *(undefined8 *)((long)(__dest_00 + -1) + 0x70) = uVar11;
                __src_00 = (pbi->common).quant_params.y_iqmatrix;
              }
              else if (uVar35 == 1) {
                uVar10 = *(undefined8 *)(pbi->common).quant_params.u_dequant_QTX;
                uVar11 = *(undefined8 *)((pbi->common).quant_params.u_dequant_QTX + 2);
                uVar12 = *(undefined8 *)((pbi->common).quant_params.u_dequant_QTX + 6);
                *(undefined8 *)((long)(__dest_00 + -1) + 0x78) =
                     *(undefined8 *)((pbi->common).quant_params.u_dequant_QTX + 4);
                *(undefined8 *)((long)(__dest_00 + -1) + 0x80) = uVar12;
                *(undefined8 *)((long)(__dest_00 + -1) + 0x68) = uVar10;
                *(undefined8 *)((long)(__dest_00 + -1) + 0x70) = uVar11;
                __src_00 = (pbi->common).quant_params.u_iqmatrix;
              }
              else {
                uVar10 = *(undefined8 *)(pbi->common).quant_params.v_dequant_QTX;
                uVar11 = *(undefined8 *)((pbi->common).quant_params.v_dequant_QTX + 2);
                uVar12 = *(undefined8 *)((pbi->common).quant_params.v_dequant_QTX + 6);
                *(undefined8 *)((long)(__dest_00 + -1) + 0x78) =
                     *(undefined8 *)((pbi->common).quant_params.v_dequant_QTX + 4);
                *(undefined8 *)((long)(__dest_00 + -1) + 0x80) = uVar12;
                *(undefined8 *)((long)(__dest_00 + -1) + 0x68) = uVar10;
                *(undefined8 *)((long)(__dest_00 + -1) + 0x70) = uVar11;
                __src_00 = (pbi->common).quant_params.v_iqmatrix;
              }
              memcpy(__dest_00,__src_00,0x4c0);
              if (uVar4 != '\0') break;
              __dest_00 = (qm_val_t *(*) [19])((long)(__dest_00 + 0x11) + 0x18);
              bVar52 = uVar35 < 2;
              uVar35 = uVar35 + 1;
            } while (bVar52);
            (pbi->td).dcb.xd.mi_stride = (pbi->common).mi_params.mi_stride;
            (pbi->td).dcb.xd.error_info = (pbi->common).error;
            cfl_init(local_48,pSVar21);
            uVar4 = ((pbi->common).seq_params)->monochrome;
            lVar27 = 0;
            do {
              (pbi->td).dcb.xd.above_entropy_context[lVar27] =
                   (pbi->common).above_contexts.entropy[lVar27][lVar36];
              lVar27 = lVar27 + 1;
            } while ((ulong)(uVar4 == '\0') * 2 + 1 != lVar27);
            (pbi->td).dcb.xd.above_partition_context =
                 (pbi->common).above_contexts.partition[lVar36];
            (pbi->td).dcb.xd.above_txfm_context = (pbi->common).above_contexts.txfm[lVar36];
            __dest = &pTVar22[lVar48 + (int)uVar31].tctx;
            memcpy(__dest,(pbi->common).fc,0x52fc);
            (pbi->td).dcb.xd.tile_ctx = __dest;
            decode_tile(pbi,local_130,uVar50,uVar31);
            aom_merge_corrupted_flag(local_50,(pbi->td).dcb.corrupted);
            uVar37 = local_70;
            if ((pbi->dcb).corrupted != 0) {
              aom_internal_error(info,AOM_CODEC_CORRUPT_FRAME,"Failed to decode tile data");
            }
          }
          uVar40 = (ulong)(uVar39 + 1);
        } while (uVar39 + 1 != uVar43);
        uVar50 = (int)local_60 + 1;
        uVar35 = (ulong)uVar50;
      } while (uVar50 != uVar32);
      data = local_120;
      if (*local_90 != 0) goto joined_r0x001680e3;
      paVar42 = &pbi->tile_data[end_tile].bit_reader;
      goto LAB_00168fe5;
    }
  }
  else {
    if (uVar45 == 0) {
      if (pbi->row_mt != 0) {
        uVar50 = (pbi->common).tiles.cols;
        iVar54 = (pbi->common).tiles.rows;
        local_ec = iVar54 * uVar50;
        uVar31 = 0;
        iVar34 = 0;
        uVar43 = uVar50;
        iVar47 = iVar54;
        goto LAB_00167135;
      }
      if (end_tile <= start_tile) {
        uVar33 = (pbi->common).tiles.cols;
        local_c0 = (pbi->common).tiles.rows;
        local_ec = local_c0 * uVar33;
        uVar50 = pbi->dec_tile_row;
        uVar31 = pbi->dec_tile_col;
        goto LAB_001672fb;
      }
LAB_001671df:
      uVar50 = (pbi->common).tiles.cols;
      iVar54 = (pbi->common).tiles.rows;
      local_ec = iVar54 * uVar50;
      uVar31 = 0;
      iVar34 = 0;
      uVar43 = uVar50;
      iVar47 = iVar54;
LAB_00167201:
      uVar45 = (end_tile - start_tile) + 1;
      if ((int)uVar33 <= end_tile - start_tile) {
        uVar45 = uVar33;
      }
      if (((iVar54 <= iVar34) || ((int)uVar43 <= (int)uVar31)) ||
         ((end_tile < (int)(iVar34 * uVar50 + uVar31) ||
          ((int)((iVar54 + -1) * uVar50 + uVar43) <= start_tile)))) goto LAB_001673bc;
      decode_mt_init(pbi);
      if ((pbi->common).tiles.large_scale == 0) {
        get_tile_buffers(pbi,data,data_end,pbi->tile_buffers,start_tile,end_tile);
        local_120 = (uint8_t *)0x0;
      }
      else {
        local_120 = get_ls_tile_buffers(pbi,data,data_end,pbi->tile_buffers);
      }
      if ((pbi->tile_data == (TileDataDec *)0x0) || (local_ec != pbi->allocated_tiles)) {
        aom_free(pbi->tile_data);
        pbi->allocated_tiles = 0;
        pTVar22 = (TileDataDec *)aom_memalign(0x20,(long)(int)local_ec * 0x53a0);
        pbi->tile_data = pTVar22;
        if (pTVar22 == (TileDataDec *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pbi->tile_data");
        }
        pbi->allocated_tiles = local_ec;
        if (0 < (int)local_ec) {
          lVar36 = 0;
          do {
            pTVar22 = pbi->tile_data;
            *(undefined1 (*) [16])((long)&(pTVar22->dec_row_mt_sync).mi_rows_parse_done + lVar36) =
                 (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&(pTVar22->dec_row_mt_sync).sync_range + lVar36) =
                 (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&(pTVar22->dec_row_mt_sync).allocated_sb_rows + lVar36) =
                 (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&(pTVar22->dec_row_mt_sync).mutex_ + lVar36) =
                 (undefined1  [16])0x0;
            lVar36 = lVar36 + 0x53a0;
          } while ((ulong)local_ec * 0x53a0 - lVar36 != 0);
        }
        pbi->allocated_row_mt_sync_rows = 0;
      }
      if ((pbi->dcb).xd.seg_mask == (uint8_t *)0x0) {
        puVar23 = (uint8_t *)aom_memalign(0x10,0x8000);
        (pbi->dcb).xd.seg_mask = puVar23;
        if (puVar23 == (uint8_t *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pbi->dcb.xd.seg_mask");
        }
      }
      if (0 < iVar47) {
        iVar20 = 0;
        do {
          if (0 < (int)uVar50) {
            lVar36 = 0;
            uVar35 = 0;
            do {
              av1_tile_init((TileInfo *)
                            ((long)(pbi->tile_data[(long)(pbi->common).tiles.cols * (long)iVar20].
                                    tctx.txb_skip_cdf + -2) + 0x3c + lVar36),cm_00,iVar20,
                            (int)uVar35);
              uVar35 = uVar35 + 1;
              lVar36 = lVar36 + 0x53a0;
            } while (uVar50 != uVar35);
          }
          iVar20 = iVar20 + 1;
        } while (iVar20 != iVar47);
      }
      tile_mt_queue(pbi,uVar50,iVar47,iVar34,iVar54,uVar31,uVar43,start_tile,end_tile);
      pAVar28 = aom_get_worker_interface();
      if ((int)uVar45 < 1) {
        aom_get_worker_interface();
        aom_get_worker_interface();
        (pbi->dcb).corrupted = 0;
      }
      else {
        uVar35 = (ulong)uVar45;
        lVar36 = uVar35 * 0x38;
        lVar27 = 0;
        lVar48 = 0;
        do {
          pAVar29 = pbi->tile_workers;
          pDVar5 = pbi->thread_data;
          memcpy(*(void **)((pDVar5->error_info).detail + lVar27 + -0x18),pbi,0x3b60);
          lVar46 = *(long *)((pDVar5->error_info).detail + lVar27 + -0x18);
          *(undefined4 *)(lVar46 + 0x3ad0) = 0;
          *(undefined8 *)(lVar46 + 0x3ad8) = *(undefined8 *)(lVar46 + 0x3eb68);
          lVar46 = *(long *)((pDVar5->error_info).detail + lVar27 + -0x18);
          *(undefined8 *)(lVar46 + 0x3ae0) = *(undefined8 *)(lVar46 + 0x3eb70);
          lVar46 = *(long *)((pDVar5->error_info).detail + lVar27 + -0x18);
          *(undefined8 *)(lVar46 + 0x3ab8) = *(undefined8 *)(lVar46 + 0x3eb88);
          if (lVar48 != 0) {
            *(undefined8 *)(lVar46 + 0x2a10) = *(undefined8 *)(lVar46 + 0x3eb78);
          }
          pcVar49 = (pDVar5->error_info).detail + lVar27 + -0x18;
          *(undefined8 *)(lVar46 + 0x3ac0) = *(undefined8 *)(lVar46 + 0x3eb90);
          lVar46 = *(long *)pcVar49;
          *(undefined8 *)(lVar46 + 0x3ac8) = *(undefined8 *)(lVar46 + 0x3eb98);
          (*pAVar28->sync)((AVxWorker *)((long)&pAVar29->impl_ + lVar48));
          *(code **)((long)&pAVar29->hook + lVar48) = tile_worker_hook;
          *(char **)((long)&pAVar29->data1 + lVar48) = pcVar49;
          *(AV1Decoder **)((long)&pAVar29->data2 + lVar48) = pbi;
          lVar48 = lVar48 + 0x38;
          lVar27 = lVar27 + 0x1b0;
        } while (lVar36 - lVar48 != 0);
        pAVar28 = aom_get_worker_interface();
        lVar48 = uVar35 - 1;
        pAVar6 = pbi->tile_workers;
        pAVar29 = pAVar6 + lVar48;
        *(uint8_t **)((long)pAVar6[lVar48].data1 + 8) = data_end;
        pAVar6[lVar48].had_error = 0;
        if (lVar48 != 0) {
          lVar46 = uVar35 * -0x38 + 0x38;
          lVar27 = lVar36 + -0x40;
          do {
            (*pAVar28->launch)(pAVar29);
            lVar48 = lVar48 + -1;
            pAVar6 = pbi->tile_workers;
            pAVar29 = pAVar6 + lVar48;
            *(uint8_t **)(*(long *)((long)pAVar6 + lVar27 + -0x10) + 8) = data_end;
            *(undefined4 *)((long)&pAVar6->impl_ + lVar27) = 0;
            lVar46 = lVar46 + 0x38;
            lVar27 = lVar27 + -0x38;
          } while (lVar48 != 0);
          pAVar29 = (AVxWorker *)((long)pAVar6 - lVar46);
        }
        (*pAVar28->execute)(pAVar29);
        pAVar28 = aom_get_worker_interface();
        local_74 = 0;
        uVar35 = uVar35 + 1;
        do {
          iVar47 = (*pAVar28->sync)((AVxWorker *)((long)&pbi->tile_workers[-1].impl_ + lVar36));
          aom_merge_corrupted_flag(&local_74,(uint)(iVar47 == 0));
          uVar35 = uVar35 - 1;
          lVar36 = lVar36 + -0x38;
        } while (1 < uVar35);
        (pbi->dcb).corrupted = local_74;
        if (local_74 != 0) {
          aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,"Failed to decode tile data");
        }
      }
      uVar33 = (pbi->common).tiles.large_scale;
    }
    else {
      if ((pbi->ext_tile_debug == 0) || (pbi->row_mt == 0)) {
        if (end_tile <= start_tile) goto LAB_0016703b;
        if (uVar45 == 0) goto LAB_001671df;
        if (pbi->ext_tile_debug != 0) {
          uVar50 = (pbi->common).tiles.cols;
          iVar47 = (pbi->common).tiles.rows;
          local_ec = iVar47 * uVar50;
          uVar45 = pbi->dec_tile_col;
          uVar31 = uVar50;
          if ((int)uVar45 < (int)uVar50) {
            uVar31 = uVar45;
          }
          iVar20 = pbi->dec_tile_row;
          iVar34 = iVar47;
          if (iVar20 < iVar47) {
            iVar34 = iVar20;
          }
          iVar54 = iVar34 + 1;
          if (iVar20 < 0) {
            iVar34 = 0;
            iVar54 = iVar47;
          }
          uVar43 = uVar31 + 1;
          if ((int)uVar45 < 0) {
            uVar31 = 0;
            uVar43 = uVar50;
          }
          goto LAB_00167201;
        }
        uVar33 = (pbi->common).tiles.cols;
        local_c0 = (pbi->common).tiles.rows;
        local_ec = local_c0 * uVar33;
        uVar50 = pbi->dec_tile_row;
        uVar31 = pbi->dec_tile_col;
        goto LAB_00167092;
      }
      uVar50 = (pbi->common).tiles.cols;
      iVar47 = (pbi->common).tiles.rows;
      local_ec = iVar47 * uVar50;
      uVar45 = pbi->dec_tile_col;
      uVar31 = uVar50;
      if ((int)uVar45 < (int)uVar50) {
        uVar31 = uVar45;
      }
      iVar20 = pbi->dec_tile_row;
      iVar34 = iVar47;
      if (iVar20 < iVar47) {
        iVar34 = iVar20;
      }
      iVar54 = iVar34 + 1;
      if (iVar20 < 0) {
        iVar34 = 0;
        iVar54 = iVar47;
      }
      uVar43 = uVar31 + 1;
      if ((int)uVar45 < 0) {
        uVar31 = 0;
        uVar43 = uVar50;
      }
LAB_00167135:
      if (((iVar54 <= iVar34) || ((int)uVar43 <= (int)uVar31)) ||
         ((end_tile < (int)(iVar34 * uVar50 + uVar31) ||
          ((int)((iVar54 + -1) * uVar50 + uVar43) <= start_tile)))) goto LAB_001673bc;
      decode_mt_init(pbi);
      if ((pbi->common).tiles.large_scale == 0) {
        get_tile_buffers(pbi,data,data_end,pbi->tile_buffers,start_tile,end_tile);
        local_120 = (uint8_t *)0x0;
      }
      else {
        local_120 = get_ls_tile_buffers(pbi,data,data_end,pbi->tile_buffers);
      }
      pTVar22 = pbi->tile_data;
      if (pTVar22 == (TileDataDec *)0x0) {
        pTVar22 = (TileDataDec *)0x0;
LAB_00168263:
        aom_free(pTVar22);
        pbi->allocated_tiles = 0;
        pTVar22 = (TileDataDec *)aom_memalign(0x20,(long)(int)local_ec * 0x53a0);
        pbi->tile_data = pTVar22;
        if (pTVar22 == (TileDataDec *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pbi->tile_data");
        }
        pbi->allocated_tiles = local_ec;
        if (0 < (int)local_ec) {
          lVar36 = 0;
          do {
            pTVar22 = pbi->tile_data;
            *(undefined1 (*) [16])((long)&(pTVar22->dec_row_mt_sync).mi_rows_parse_done + lVar36) =
                 (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&(pTVar22->dec_row_mt_sync).sync_range + lVar36) =
                 (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&(pTVar22->dec_row_mt_sync).allocated_sb_rows + lVar36) =
                 (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&(pTVar22->dec_row_mt_sync).mutex_ + lVar36) =
                 (undefined1  [16])0x0;
            lVar36 = lVar36 + 0x53a0;
          } while ((ulong)local_ec * 0x53a0 - lVar36 != 0);
        }
        pbi->allocated_row_mt_sync_rows = 0;
      }
      else if (local_ec != pbi->allocated_tiles) {
        if (0 < pbi->allocated_tiles) {
          lVar36 = 0x5360;
          lVar48 = 0;
          do {
            av1_dec_row_mt_dealloc
                      ((AV1DecRowMTSync *)
                       ((long)((pbi->tile_data->tctx).txb_skip_cdf + -2) + 0x3c + lVar36));
            lVar48 = lVar48 + 1;
            lVar36 = lVar36 + 0x53a0;
          } while (lVar48 < pbi->allocated_tiles);
          pTVar22 = pbi->tile_data;
        }
        goto LAB_00168263;
      }
      if ((pbi->dcb).xd.seg_mask == (uint8_t *)0x0) {
        puVar23 = (uint8_t *)aom_memalign(0x10,0x8000);
        (pbi->dcb).xd.seg_mask = puVar23;
        if (puVar23 == (uint8_t *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pbi->dcb.xd.seg_mask");
        }
      }
      if (iVar47 < 1) {
        uVar45 = 0;
        local_150 = 0;
      }
      else {
        iVar20 = 0;
        local_150 = 0;
        uVar45 = 0;
        do {
          if (0 < (int)uVar50) {
            lVar36 = 0;
            uVar35 = 0;
            do {
              pTVar44 = (TileInfo *)
                        ((long)(pbi->tile_data[(long)(pbi->common).tiles.cols * (long)iVar20].tctx.
                                txb_skip_cdf + -2) + 0x3c + lVar36);
              av1_tile_init(pTVar44,cm_00,iVar20,(int)uVar35);
              iVar19 = av1_get_sb_rows_in_tile(cm_00,pTVar44);
              if ((int)local_150 <= iVar19) {
                local_150 = av1_get_sb_rows_in_tile(cm_00,pTVar44);
              }
              iVar19 = av1_get_sb_rows_in_tile(cm_00,pTVar44);
              uVar45 = (uVar45 - (iVar19 == 1)) + 2;
              uVar35 = uVar35 + 1;
              lVar36 = lVar36 + 0x53a0;
            } while (uVar50 != uVar35);
          }
          iVar20 = iVar20 + 1;
        } while (iVar20 != iVar47);
      }
      if ((int)uVar45 < (int)uVar33) {
        uVar33 = uVar45;
      }
      lVar36 = (long)(int)local_150;
      if (pbi->allocated_row_mt_sync_rows != local_150) {
        if (0 < (int)local_ec) {
          uVar35 = 0;
          do {
            pTVar22 = pbi->tile_data;
            dec_row_mt_sync = &pTVar22[uVar35].dec_row_mt_sync;
            av1_dec_row_mt_dealloc(dec_row_mt_sync);
            pTVar22[uVar35].dec_row_mt_sync.allocated_sb_rows = local_150;
            ppVar24 = (pthread_mutex_t *)aom_malloc(lVar36 * 0x28);
            dec_row_mt_sync->mutex_ = ppVar24;
            if (ppVar24 == (pthread_mutex_t *)0x0) {
              aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate dec_row_mt_sync->mutex_");
              if ((0 < (int)local_150) && (dec_row_mt_sync->mutex_ != (pthread_mutex_t *)0x0))
              goto LAB_00168554;
LAB_00168574:
              ppVar25 = (pthread_cond_t *)aom_malloc(lVar36 * 0x30);
              pTVar22[uVar35].dec_row_mt_sync.cond_ = ppVar25;
              if (ppVar25 == (pthread_cond_t *)0x0) {
LAB_00168597:
                aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                                   "Failed to allocate dec_row_mt_sync->cond_");
                if (((int)local_150 < 1) ||
                   (pTVar22[uVar35].dec_row_mt_sync.cond_ == (pthread_cond_t *)0x0))
                goto LAB_001685e6;
              }
              else if ((int)local_150 < 1) goto LAB_001685e6;
              lVar48 = 0;
              uVar37 = (ulong)local_150;
              do {
                pthread_cond_init((pthread_cond_t *)
                                  ((long)pTVar22[uVar35].dec_row_mt_sync.cond_ + lVar48),
                                  (pthread_condattr_t *)0x0);
                lVar48 = lVar48 + 0x30;
                uVar37 = uVar37 - 1;
              } while (uVar37 != 0);
            }
            else {
              if (0 < (int)local_150) {
LAB_00168554:
                lVar48 = 0;
                uVar37 = (ulong)local_150;
                do {
                  pthread_mutex_init((pthread_mutex_t *)((long)dec_row_mt_sync->mutex_ + lVar48),
                                     (pthread_mutexattr_t *)0x0);
                  lVar48 = lVar48 + 0x28;
                  uVar37 = uVar37 - 1;
                } while (uVar37 != 0);
                goto LAB_00168574;
              }
              ppVar25 = (pthread_cond_t *)aom_malloc(lVar36 * 0x30);
              pTVar22[uVar35].dec_row_mt_sync.cond_ = ppVar25;
              if (ppVar25 == (pthread_cond_t *)0x0) goto LAB_00168597;
            }
LAB_001685e6:
            piVar26 = (int *)aom_malloc(lVar36 * 4);
            pTVar22[uVar35].dec_row_mt_sync.cur_sb_col = piVar26;
            if (piVar26 == (int *)0x0) {
              aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate dec_row_mt_sync->cur_sb_col");
            }
            pTVar22[uVar35].dec_row_mt_sync.sync_range = 1;
            uVar35 = uVar35 + 1;
          } while (uVar35 != local_ec);
        }
        pbi->allocated_row_mt_sync_rows = local_150;
      }
      tile_mt_queue(pbi,uVar50,iVar47,iVar34,iVar54,uVar31,uVar43,start_tile,end_tile);
      bVar30 = (byte)((pbi->common).seq_params)->mib_size_log2;
      iVar47 = (((pbi->common).mi_params.mi_cols >> (bVar30 & 0x1f)) + 1) *
               (((pbi->common).mi_params.mi_rows >> (bVar30 & 0x1f)) + 1);
      if (pbi->cb_buffer_alloc_size < iVar47) {
        av1_dec_free_cb_buf(pbi);
        __s = (CB_BUFFER *)aom_memalign(0x20,(long)iVar47 * 0x3b000);
        pbi->cb_buffer_base = __s;
        if (__s == (CB_BUFFER *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pbi->cb_buffer_base");
          __s = pbi->cb_buffer_base;
        }
        memset(__s,0,(long)iVar47 * 0x3b000);
        pbi->cb_buffer_alloc_size = iVar47;
      }
      (pbi->frame_row_mt_info).tile_rows_start = iVar34;
      (pbi->frame_row_mt_info).tile_rows_end = iVar54;
      (pbi->frame_row_mt_info).tile_cols_start = uVar31;
      (pbi->frame_row_mt_info).tile_cols_end = uVar43;
      (pbi->frame_row_mt_info).start_tile = start_tile;
      (pbi->frame_row_mt_info).end_tile = end_tile;
      (pbi->frame_row_mt_info).mi_rows_to_decode = 0;
      (pbi->frame_row_mt_info).mi_rows_parse_done = 0;
      (pbi->frame_row_mt_info).mi_rows_decode_started = 0;
      (pbi->frame_row_mt_info).row_mt_exit = 0;
      lVar27 = (long)(int)uVar31 * 0x53a0 + 0x5398;
      lVar48 = lVar27;
      uVar50 = uVar31;
      do {
        iVar47 = (pbi->common).tiles.cols * iVar34;
        if ((int)(uVar50 + iVar47) <= end_tile && start_tile <= (int)(uVar50 + iVar47)) {
          pTVar22 = pbi->tile_data;
          *(undefined8 *)((long)(pTVar22[iVar47].tctx.txb_skip_cdf + -2) + 0x34 + lVar48) = 0;
          *(undefined4 *)((long)(pTVar22[iVar47].tctx.txb_skip_cdf + -2) + 0x3c + lVar48) = 0;
          uVar32 = -1 << ((byte)((pbi->common).seq_params)->mib_size_log2 & 0x1f);
          *(uint *)((long)(pTVar22[iVar47].tctx.txb_skip_cdf + -2) + 0x2c + lVar48) =
               (*(int *)((long)pTVar22 + lVar48 + -0x5394 + (long)iVar47 * 0x53a0) -
               *(int *)((long)pTVar22 + lVar48 + -0x5398 + (long)iVar47 * 0x53a0)) + ~uVar32 &
               uVar32;
          *(uint *)((long)(pTVar22[iVar47].tctx.txb_skip_cdf + -2) + 0x30 + lVar48) =
               (~uVar32 + *(int *)((long)pTVar22 + lVar48 + -0x538c + (long)iVar47 * 0x53a0)) -
               *(int *)((long)pTVar22 + lVar48 + -0x5390 + (long)iVar47 * 0x53a0) & uVar32;
          iVar20 = av1_get_intrabc_extra_top_right_sb_delay(cm_00);
          *(int *)((long)(pTVar22[iVar47].tctx.txb_skip_cdf + -2) + 0x28 + lVar48) = iVar20;
          piVar26 = &(pbi->frame_row_mt_info).mi_rows_to_decode;
          *piVar26 = *piVar26 +
                     *(int *)((long)(pTVar22[iVar47].tctx.txb_skip_cdf + -2) + 0x2c + lVar48);
          memset(*(void **)((long)(pTVar22[iVar47].tctx.txb_skip_cdf + -2) + 0x1c + lVar48),0xff,
                 lVar36 << 2);
        }
        uVar50 = uVar50 + 1;
        lVar48 = lVar48 + 0x53a0;
      } while ((uVar43 != uVar50) ||
              (iVar34 = iVar34 + 1, lVar48 = lVar27, uVar50 = uVar31, iVar34 != iVar54));
      if (pbi->row_mt_mutex_ == (pthread_mutex_t *)0x0) {
        ppVar24 = (pthread_mutex_t *)aom_malloc(0x28);
        pbi->row_mt_mutex_ = ppVar24;
        if (ppVar24 == (pthread_mutex_t *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pbi->row_mt_mutex_");
          ppVar24 = pbi->row_mt_mutex_;
          if (ppVar24 == (pthread_mutex_t *)0x0) goto LAB_001688d6;
        }
        pthread_mutex_init((pthread_mutex_t *)ppVar24,(pthread_mutexattr_t *)0x0);
      }
LAB_001688d6:
      if (pbi->row_mt_cond_ == (pthread_cond_t *)0x0) {
        __cond = (pthread_cond_t *)aom_malloc(0x30);
        pbi->row_mt_cond_ = (pthread_cond_t *)__cond;
        if (__cond == (pthread_cond_t *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pbi->row_mt_cond_");
          __cond = (pthread_cond_t *)pbi->row_mt_cond_;
          if (__cond == (pthread_cond_t *)0x0) goto LAB_00168935;
        }
        pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
      }
LAB_00168935:
      pAVar28 = aom_get_worker_interface();
      if ((int)uVar45 < 1) {
        aom_get_worker_interface();
        aom_get_worker_interface();
        (pbi->dcb).corrupted = 0;
      }
      else {
        uVar35 = (ulong)uVar33;
        lVar48 = 0;
        lVar36 = 0;
        uVar37 = uVar35;
        do {
          pAVar29 = pbi->tile_workers;
          pDVar5 = pbi->thread_data;
          memcpy(*(void **)((pDVar5->error_info).detail + lVar36 + -0x18),pbi,0x3b60);
          lVar27 = *(long *)((pDVar5->error_info).detail + lVar36 + -0x18);
          *(undefined4 *)(lVar27 + 0x3ad0) = 0;
          *(undefined8 *)(lVar27 + 0x3ad8) = *(undefined8 *)(lVar27 + 0x3eb68);
          lVar27 = *(long *)((pDVar5->error_info).detail + lVar36 + -0x18);
          *(undefined8 *)(lVar27 + 0x3ae0) = *(undefined8 *)(lVar27 + 0x3eb70);
          lVar27 = *(long *)((pDVar5->error_info).detail + lVar36 + -0x18);
          *(undefined8 *)(lVar27 + 0x3ab8) = *(undefined8 *)(lVar27 + 0x3eb88);
          if (lVar36 != 0) {
            *(undefined8 *)(lVar27 + 0x2a10) = *(undefined8 *)(lVar27 + 0x3eb78);
          }
          pcVar49 = (pDVar5->error_info).detail + lVar36 + -0x18;
          *(undefined8 *)(lVar27 + 0x3ac0) = *(undefined8 *)(lVar27 + 0x3eb90);
          lVar27 = *(long *)pcVar49;
          *(undefined8 *)(lVar27 + 0x3ac8) = *(undefined8 *)(lVar27 + 0x3eb98);
          (*pAVar28->sync)((AVxWorker *)((long)&pAVar29->impl_ + lVar48));
          *(code **)((long)&pAVar29->hook + lVar48) = row_mt_worker_hook;
          *(char **)((long)&pAVar29->data1 + lVar48) = pcVar49;
          *(AV1Decoder **)((long)&pAVar29->data2 + lVar48) = pbi;
          lVar36 = lVar36 + 0x1b0;
          lVar48 = lVar48 + 0x38;
          uVar37 = uVar37 - 1;
        } while (uVar37 != 0);
        pAVar28 = aom_get_worker_interface();
        lVar36 = uVar35 - 1;
        pAVar6 = pbi->tile_workers;
        pAVar29 = pAVar6 + lVar36;
        *(uint8_t **)((long)pAVar6[lVar36].data1 + 8) = data_end;
        pAVar6[lVar36].had_error = 0;
        if (lVar36 != 0) {
          lVar48 = uVar35 * -0x38 + 0x38;
          lVar27 = uVar35 * 0x38 + -0x40;
          do {
            (*pAVar28->launch)(pAVar29);
            lVar36 = lVar36 + -1;
            pAVar6 = pbi->tile_workers;
            pAVar29 = pAVar6 + lVar36;
            *(uint8_t **)(*(long *)((long)pAVar6 + lVar27 + -0x10) + 8) = data_end;
            *(undefined4 *)((long)&pAVar6->impl_ + lVar27) = 0;
            lVar48 = lVar48 + 0x38;
            lVar27 = lVar27 + -0x38;
          } while (lVar36 != 0);
          pAVar29 = (AVxWorker *)((long)pAVar6 - lVar48);
        }
        (*pAVar28->execute)(pAVar29);
        pAVar28 = aom_get_worker_interface();
        local_78 = 0;
        uVar37 = uVar35 + 1;
        lVar36 = uVar35 * 0x38;
        do {
          iVar47 = (*pAVar28->sync)((AVxWorker *)((long)&pbi->tile_workers[-1].impl_ + lVar36));
          aom_merge_corrupted_flag(&local_78,(uint)(iVar47 == 0));
          uVar37 = uVar37 - 1;
          lVar36 = lVar36 + -0x38;
        } while (1 < uVar37);
        (pbi->dcb).corrupted = local_78;
        if (local_78 != 0) {
          aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,"Failed to decode tile data");
        }
      }
      uVar33 = (pbi->common).tiles.large_scale;
    }
    data = local_120;
    if (uVar33 == 0) {
      paVar42 = &pbi->tile_data[end_tile].bit_reader;
    }
    else {
joined_r0x001680e3:
      if (local_ec != 1) goto LAB_001673bc;
      paVar42 = &pbi->tile_data->bit_reader;
    }
LAB_00168fe5:
    data = aom_reader_find_end(paVar42);
  }
LAB_001673bc:
  *local_68 = data;
  if (uVar3 != '\0') {
    pSVar21 = (pbi->common).seq_params;
    pYVar41 = (pbi->dcb).xd.cur_buf;
    if (pSVar21->use_highbitdepth == '\0') {
      iVar47 = (pYVar41->field_3).field_0.uv_crop_height;
      lVar36 = 1;
      do {
        if (0 < iVar47) {
          iVar20 = 0;
          do {
            memset(pYVar41->store_buf_adr[lVar36 + -4] +
                   (long)(pYVar41->field_4).field_0.uv_stride * (long)iVar20,0x80,
                   (long)(pYVar41->field_2).field_0.uv_crop_width);
            iVar20 = iVar20 + 1;
            iVar47 = (pYVar41->field_3).field_0.uv_crop_height;
          } while (iVar20 < iVar47);
        }
        lVar36 = lVar36 + 1;
      } while (lVar36 != 3);
    }
    else {
      aVar13 = pSVar21->bit_depth;
      iVar47 = (pYVar41->field_3).field_0.uv_crop_height;
      lVar36 = 1;
      do {
        auVar18 = _DAT_004c9f70;
        auVar17 = _DAT_004c9f60;
        auVar16 = _DAT_004c83c0;
        auVar15 = _DAT_004c83b0;
        auVar14 = _DAT_004c83a0;
        if (0 < iVar47) {
          __src = (void *)((long)pYVar41->store_buf_adr[lVar36 + -4] * 2);
          lVar48 = (long)(pYVar41->field_2).field_0.uv_crop_width;
          if (lVar48 != 0) {
            lVar27 = lVar48 + -1;
            auVar53._8_4_ = (int)lVar27;
            auVar53._0_8_ = lVar27;
            auVar53._12_4_ = (int)((ulong)lVar27 >> 0x20);
            auVar53 = auVar53 ^ _DAT_004c83c0;
            uVar35 = 0;
            do {
              auVar64._8_4_ = (int)uVar35;
              auVar64._0_8_ = uVar35;
              auVar64._12_4_ = (int)(uVar35 >> 0x20);
              auVar56 = (auVar64 | auVar15) ^ auVar16;
              iVar47 = auVar53._0_4_;
              iVar19 = -(uint)(iVar47 < auVar56._0_4_);
              iVar20 = auVar53._4_4_;
              auVar57._4_4_ = -(uint)(iVar20 < auVar56._4_4_);
              iVar34 = auVar53._8_4_;
              iVar70 = -(uint)(iVar34 < auVar56._8_4_);
              iVar54 = auVar53._12_4_;
              auVar57._12_4_ = -(uint)(iVar54 < auVar56._12_4_);
              auVar66._4_4_ = iVar19;
              auVar66._0_4_ = iVar19;
              auVar66._8_4_ = iVar70;
              auVar66._12_4_ = iVar70;
              auVar71 = pshuflw(in_XMM5,auVar66,0xe8);
              auVar59._4_4_ = -(uint)(auVar56._4_4_ == iVar20);
              auVar59._12_4_ = -(uint)(auVar56._12_4_ == iVar54);
              auVar59._0_4_ = auVar59._4_4_;
              auVar59._8_4_ = auVar59._12_4_;
              auVar73 = pshuflw(in_XMM6,auVar59,0xe8);
              auVar57._0_4_ = auVar57._4_4_;
              auVar57._8_4_ = auVar57._12_4_;
              auVar72 = pshuflw(auVar71,auVar57,0xe8);
              auVar56._8_4_ = 0xffffffff;
              auVar56._0_8_ = 0xffffffffffffffff;
              auVar56._12_4_ = 0xffffffff;
              auVar56 = (auVar72 | auVar73 & auVar71) ^ auVar56;
              auVar56 = packssdw(auVar56,auVar56);
              uVar38 = (undefined2)(1 << ((char)aVar13 - 1 & 0x1f));
              if ((auVar56 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)__src + uVar35 * 2) = uVar38;
              }
              auVar57 = auVar59 & auVar66 | auVar57;
              auVar56 = packssdw(auVar57,auVar57);
              auVar72._8_4_ = 0xffffffff;
              auVar72._0_8_ = 0xffffffffffffffff;
              auVar72._12_4_ = 0xffffffff;
              auVar56 = packssdw(auVar56 ^ auVar72,auVar56 ^ auVar72);
              if ((auVar56._0_4_ >> 0x10 & 1) != 0) {
                *(undefined2 *)((long)__src + uVar35 * 2 + 2) = uVar38;
              }
              auVar56 = (auVar64 | auVar14) ^ auVar16;
              iVar19 = -(uint)(iVar47 < auVar56._0_4_);
              auVar69._4_4_ = -(uint)(iVar20 < auVar56._4_4_);
              iVar70 = -(uint)(iVar34 < auVar56._8_4_);
              auVar69._12_4_ = -(uint)(iVar54 < auVar56._12_4_);
              auVar58._4_4_ = iVar19;
              auVar58._0_4_ = iVar19;
              auVar58._8_4_ = iVar70;
              auVar58._12_4_ = iVar70;
              auVar65._4_4_ = -(uint)(auVar56._4_4_ == iVar20);
              auVar65._12_4_ = -(uint)(auVar56._12_4_ == iVar54);
              auVar65._0_4_ = auVar65._4_4_;
              auVar65._8_4_ = auVar65._12_4_;
              auVar69._0_4_ = auVar69._4_4_;
              auVar69._8_4_ = auVar69._12_4_;
              auVar56 = auVar65 & auVar58 | auVar69;
              auVar56 = packssdw(auVar56,auVar56);
              auVar7._8_4_ = 0xffffffff;
              auVar7._0_8_ = 0xffffffffffffffff;
              auVar7._12_4_ = 0xffffffff;
              auVar56 = packssdw(auVar56 ^ auVar7,auVar56 ^ auVar7);
              if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)__src + uVar35 * 2 + 4) = uVar38;
              }
              auVar59 = pshufhw(auVar58,auVar58,0x84);
              auVar66 = pshufhw(auVar65,auVar65,0x84);
              auVar57 = pshufhw(auVar59,auVar69,0x84);
              auVar60._8_4_ = 0xffffffff;
              auVar60._0_8_ = 0xffffffffffffffff;
              auVar60._12_4_ = 0xffffffff;
              auVar60 = (auVar57 | auVar66 & auVar59) ^ auVar60;
              auVar59 = packssdw(auVar60,auVar60);
              if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)__src + uVar35 * 2 + 6) = uVar38;
              }
              auVar59 = (auVar64 | auVar18) ^ auVar16;
              iVar19 = -(uint)(iVar47 < auVar59._0_4_);
              auVar62._4_4_ = -(uint)(iVar20 < auVar59._4_4_);
              iVar70 = -(uint)(iVar34 < auVar59._8_4_);
              auVar62._12_4_ = -(uint)(iVar54 < auVar59._12_4_);
              auVar67._4_4_ = iVar19;
              auVar67._0_4_ = iVar19;
              auVar67._8_4_ = iVar70;
              auVar67._12_4_ = iVar70;
              auVar56 = pshuflw(auVar56,auVar67,0xe8);
              auVar61._4_4_ = -(uint)(auVar59._4_4_ == iVar20);
              auVar61._12_4_ = -(uint)(auVar59._12_4_ == iVar54);
              auVar61._0_4_ = auVar61._4_4_;
              auVar61._8_4_ = auVar61._12_4_;
              auVar59 = pshuflw(auVar73 & auVar71,auVar61,0xe8);
              in_XMM6 = auVar59 & auVar56;
              auVar62._0_4_ = auVar62._4_4_;
              auVar62._8_4_ = auVar62._12_4_;
              auVar56 = pshuflw(auVar56,auVar62,0xe8);
              auVar71._8_4_ = 0xffffffff;
              auVar71._0_8_ = 0xffffffffffffffff;
              auVar71._12_4_ = 0xffffffff;
              auVar71 = (auVar56 | in_XMM6) ^ auVar71;
              in_XMM5 = packssdw(auVar71,auVar71);
              if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)__src + uVar35 * 2 + 8) = uVar38;
              }
              auVar62 = auVar61 & auVar67 | auVar62;
              auVar56 = packssdw(auVar62,auVar62);
              auVar73._8_4_ = 0xffffffff;
              auVar73._0_8_ = 0xffffffffffffffff;
              auVar73._12_4_ = 0xffffffff;
              auVar56 = packssdw(auVar56 ^ auVar73,auVar56 ^ auVar73);
              if ((auVar56 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)__src + uVar35 * 2 + 10) = uVar38;
              }
              auVar56 = (auVar64 | auVar17) ^ auVar16;
              iVar47 = -(uint)(iVar47 < auVar56._0_4_);
              auVar68._4_4_ = -(uint)(iVar20 < auVar56._4_4_);
              iVar34 = -(uint)(iVar34 < auVar56._8_4_);
              auVar68._12_4_ = -(uint)(iVar54 < auVar56._12_4_);
              auVar63._4_4_ = iVar47;
              auVar63._0_4_ = iVar47;
              auVar63._8_4_ = iVar34;
              auVar63._12_4_ = iVar34;
              auVar55._4_4_ = -(uint)(auVar56._4_4_ == iVar20);
              auVar55._12_4_ = -(uint)(auVar56._12_4_ == iVar54);
              auVar55._0_4_ = auVar55._4_4_;
              auVar55._8_4_ = auVar55._12_4_;
              auVar68._0_4_ = auVar68._4_4_;
              auVar68._8_4_ = auVar68._12_4_;
              auVar56 = auVar55 & auVar63 | auVar68;
              auVar56 = packssdw(auVar56,auVar56);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              auVar56 = packssdw(auVar56 ^ auVar8,auVar56 ^ auVar8);
              if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)__src + uVar35 * 2 + 0xc) = uVar38;
              }
              auVar64 = pshufhw(auVar63,auVar63,0x84);
              auVar56 = pshufhw(auVar55,auVar55,0x84);
              auVar59 = pshufhw(auVar64,auVar68,0x84);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar56 = packssdw(auVar56 & auVar64,(auVar59 | auVar56 & auVar64) ^ auVar9);
              if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)__src + uVar35 * 2 + 0xe) = uVar38;
              }
              uVar35 = uVar35 + 8;
            } while ((lVar48 + 7U & 0xfffffffffffffff8) != uVar35);
            iVar47 = (pYVar41->field_3).field_0.uv_crop_height;
          }
          if (1 < iVar47) {
            iVar20 = 1;
            do {
              memcpy((void *)((long)__src +
                             (long)(pYVar41->field_4).field_0.uv_stride * (long)iVar20 * 2),__src,
                     (long)(pYVar41->field_2).field_0.uv_crop_width * 2);
              iVar20 = iVar20 + 1;
              iVar47 = (pYVar41->field_3).field_0.uv_crop_height;
            } while (iVar20 < iVar47);
          }
        }
        lVar36 = lVar36 + 1;
      } while (lVar36 != 3);
    }
  }
  if ((pbi->common).tiles.cols * (pbi->common).tiles.rows + -1 != end_tile) {
    return;
  }
  cdef_sync = &pbi->cdef_sync;
  av1_alloc_cdef_buffers(cm_00,&pbi->cdef_worker,cdef_sync,pbi->num_workers,1);
  av1_alloc_cdef_sync(cm_00,cdef_sync,pbi->num_workers);
  if (((pbi->common).features.allow_intrabc != false) ||
     ((pbi->common).tiles.single_tile_decoding != 0)) goto LAB_001677a5;
  if (((pbi->common).lf.filter_level[0] != 0) || ((pbi->common).lf.filter_level[1] != 0)) {
    av1_loop_filter_frame_mt
              (&((pbi->common).cur_frame)->buf,cm_00,(MACROBLOCKD *)pbi,0,
               (uint)(uVar3 == '\0') * 2 + 1,0,pbi->tile_workers,pbi->num_workers,&pbi->lf_row_sync,
               0);
  }
  if ((pbi->skip_loop_filter == 0) && ((pbi->common).features.coded_lossless == false)) {
    bVar52 = true;
    if (((pbi->common).cdef_info.cdef_bits == 0) && ((pbi->common).cdef_info.cdef_strengths[0] == 0)
       ) {
      bVar52 = (pbi->common).cdef_info.cdef_uv_strengths[0] != 0;
    }
  }
  else {
    bVar52 = false;
  }
  bVar30 = ~bVar52 & (pbi->common).width == (pbi->common).superres_upscaled_width;
  bVar51 = true;
  if (((pbi->common).rst_info[0].frame_restoration_type == RESTORE_NONE) &&
     ((pbi->common).rst_info[1].frame_restoration_type == RESTORE_NONE)) {
    bVar51 = (pbi->common).rst_info[2].frame_restoration_type != RESTORE_NONE;
  }
  if (bVar30 == 0) {
    if (bVar51) {
      av1_loop_restoration_save_boundary_lines(&((pbi->common).cur_frame)->buf,cm_00,0);
    }
    if (bVar52 != false) {
      if (pbi->num_workers < 2) {
        av1_cdef_frame(&((pbi->common).cur_frame)->buf,cm_00,(MACROBLOCKD *)pbi,av1_cdef_init_fb_row
                      );
      }
      else {
        av1_cdef_frame_mt(cm_00,(MACROBLOCKD *)pbi,pbi->cdef_worker,pbi->tile_workers,cdef_sync,
                          pbi->num_workers,av1_cdef_init_fb_row_mt,0);
      }
    }
    if ((pbi->common).width != (pbi->common).superres_upscaled_width) {
      av1_superres_upscale(cm_00,(pbi->common).buffer_pool,false);
    }
    if (!bVar51) goto LAB_001677a5;
    av1_loop_restoration_save_boundary_lines(&((pbi->common).cur_frame)->buf,cm_00,1);
    iVar47 = pbi->num_workers;
    pYVar41 = (pbi->dcb).xd.cur_buf;
    if (1 < iVar47) {
      pAVar29 = pbi->tile_workers;
      goto LAB_001681ab;
    }
  }
  else {
    if (!bVar51) goto LAB_001677a5;
    iVar47 = pbi->num_workers;
    pYVar41 = (pbi->dcb).xd.cur_buf;
    if (1 < iVar47) {
      pAVar29 = pbi->tile_workers;
LAB_001681ab:
      av1_loop_restoration_filter_frame_mt
                (pYVar41,cm_00,(uint)bVar30,pAVar29,iVar47,&pbi->lr_row_sync,&pbi->lr_ctxt,0);
      goto LAB_001677a5;
    }
  }
  av1_loop_restoration_filter_frame(pYVar41,cm_00,(uint)bVar30,&pbi->lr_ctxt);
LAB_001677a5:
  if ((pbi->dcb).corrupted == 0) {
    if ((pbi->common).features.refresh_frame_context == '\x01') {
      memcpy((pbi->common).fc,&pbi->tile_data[pbi->context_update_tile_id].tctx,0x52fc);
      av1_reset_cdf_symbol_counters((pbi->common).fc);
    }
  }
  else {
    aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,"Decode failed. Frame data is corrupted."
                      );
  }
  if ((pbi->common).tiles.large_scale == 0) {
    memcpy(&((pbi->common).cur_frame)->frame_context,(pbi->common).fc,0x52fc);
  }
  if (((pbi->common).show_frame != 0) &&
     ((((pbi->common).seq_params)->order_hint_info).enable_order_hint == 0)) {
    puVar1 = &(pbi->common).current_frame.frame_number;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void av1_decode_tg_tiles_and_wrapup(AV1Decoder *pbi, const uint8_t *data,
                                    const uint8_t *data_end,
                                    const uint8_t **p_data_end, int start_tile,
                                    int end_tile, int initialize_flag) {
  AV1_COMMON *const cm = &pbi->common;
  CommonTileParams *const tiles = &cm->tiles;
  MACROBLOCKD *const xd = &pbi->dcb.xd;
  const int tile_count_tg = end_tile - start_tile + 1;

  xd->error_info = cm->error;
  if (initialize_flag) setup_frame_info(pbi);
  const int num_planes = av1_num_planes(cm);

  if (pbi->max_threads > 1 && !(tiles->large_scale && !pbi->ext_tile_debug) &&
      pbi->row_mt)
    *p_data_end =
        decode_tiles_row_mt(pbi, data, data_end, start_tile, end_tile);
  else if (pbi->max_threads > 1 && tile_count_tg > 1 &&
           !(tiles->large_scale && !pbi->ext_tile_debug))
    *p_data_end = decode_tiles_mt(pbi, data, data_end, start_tile, end_tile);
  else
    *p_data_end = decode_tiles(pbi, data, data_end, start_tile, end_tile);

  // If the bit stream is monochrome, set the U and V buffers to a constant.
  if (num_planes < 3) {
    set_planes_to_neutral_grey(cm->seq_params, xd->cur_buf, 1);
  }

  if (end_tile != tiles->rows * tiles->cols - 1) {
    return;
  }

  av1_alloc_cdef_buffers(cm, &pbi->cdef_worker, &pbi->cdef_sync,
                         pbi->num_workers, 1);
  av1_alloc_cdef_sync(cm, &pbi->cdef_sync, pbi->num_workers);

  if (!cm->features.allow_intrabc && !tiles->single_tile_decoding) {
    if (cm->lf.filter_level[0] || cm->lf.filter_level[1]) {
      av1_loop_filter_frame_mt(&cm->cur_frame->buf, cm, &pbi->dcb.xd, 0,
                               num_planes, 0, pbi->tile_workers,
                               pbi->num_workers, &pbi->lf_row_sync, 0);
    }

    const int do_cdef =
        !pbi->skip_loop_filter && !cm->features.coded_lossless &&
        (cm->cdef_info.cdef_bits || cm->cdef_info.cdef_strengths[0] ||
         cm->cdef_info.cdef_uv_strengths[0]);
    const int do_superres = av1_superres_scaled(cm);
    const int optimized_loop_restoration = !do_cdef && !do_superres;
    const int do_loop_restoration =
        cm->rst_info[0].frame_restoration_type != RESTORE_NONE ||
        cm->rst_info[1].frame_restoration_type != RESTORE_NONE ||
        cm->rst_info[2].frame_restoration_type != RESTORE_NONE;
    // Frame border extension is not required in the decoder
    // as it happens in extend_mc_border().
    int do_extend_border_mt = 0;
    if (!optimized_loop_restoration) {
      if (do_loop_restoration)
        av1_loop_restoration_save_boundary_lines(&pbi->common.cur_frame->buf,
                                                 cm, 0);

      if (do_cdef) {
        if (pbi->num_workers > 1) {
          av1_cdef_frame_mt(cm, &pbi->dcb.xd, pbi->cdef_worker,
                            pbi->tile_workers, &pbi->cdef_sync,
                            pbi->num_workers, av1_cdef_init_fb_row_mt,
                            do_extend_border_mt);
        } else {
          av1_cdef_frame(&pbi->common.cur_frame->buf, cm, &pbi->dcb.xd,
                         av1_cdef_init_fb_row);
        }
      }

      superres_post_decode(pbi);

      if (do_loop_restoration) {
        av1_loop_restoration_save_boundary_lines(&pbi->common.cur_frame->buf,
                                                 cm, 1);
        if (pbi->num_workers > 1) {
          av1_loop_restoration_filter_frame_mt(
              (YV12_BUFFER_CONFIG *)xd->cur_buf, cm, optimized_loop_restoration,
              pbi->tile_workers, pbi->num_workers, &pbi->lr_row_sync,
              &pbi->lr_ctxt, do_extend_border_mt);
        } else {
          av1_loop_restoration_filter_frame((YV12_BUFFER_CONFIG *)xd->cur_buf,
                                            cm, optimized_loop_restoration,
                                            &pbi->lr_ctxt);
        }
      }
    } else {
      // In no cdef and no superres case. Provide an optimized version of
      // loop_restoration_filter.
      if (do_loop_restoration) {
        if (pbi->num_workers > 1) {
          av1_loop_restoration_filter_frame_mt(
              (YV12_BUFFER_CONFIG *)xd->cur_buf, cm, optimized_loop_restoration,
              pbi->tile_workers, pbi->num_workers, &pbi->lr_row_sync,
              &pbi->lr_ctxt, do_extend_border_mt);
        } else {
          av1_loop_restoration_filter_frame((YV12_BUFFER_CONFIG *)xd->cur_buf,
                                            cm, optimized_loop_restoration,
                                            &pbi->lr_ctxt);
        }
      }
    }
  }

  if (!pbi->dcb.corrupted) {
    if (cm->features.refresh_frame_context == REFRESH_FRAME_CONTEXT_BACKWARD) {
      assert(pbi->context_update_tile_id < pbi->allocated_tiles);
      *cm->fc = pbi->tile_data[pbi->context_update_tile_id].tctx;
      av1_reset_cdf_symbol_counters(cm->fc);
    }
  } else {
    aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                       "Decode failed. Frame data is corrupted.");
  }

#if CONFIG_INSPECTION
  if (pbi->inspect_cb != NULL) {
    (*pbi->inspect_cb)(pbi, pbi->inspect_ctx);
  }
#endif

  // Non frame parallel update frame context here.
  if (!tiles->large_scale) {
    cm->cur_frame->frame_context = *cm->fc;
  }

  if (cm->show_frame && !cm->seq_params->order_hint_info.enable_order_hint) {
    ++cm->current_frame.frame_number;
  }
}